

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

SIMDTernary * __thiscall MixedArena::alloc<wasm::SIMDTernary>(MixedArena *this)

{
  SIMDTernary *pSVar1;
  
  pSVar1 = (SIMDTernary *)allocSpace(this,0x30,8);
  *(undefined8 *)&(pSVar1->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression = 0;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression.type.id = 0;
  *(undefined8 *)&pSVar1->op = 0;
  pSVar1->a = (Expression *)0x0;
  pSVar1->b = (Expression *)0x0;
  pSVar1->c = (Expression *)0x0;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression._id = SIMDTernaryId;
  return pSVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }